

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                 (char *begin,char *end,
                 format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *handler)

{
  uint uVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out;
  buffer_appender<char> out_00;
  char cVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_01;
  int in_ECX;
  ulong uVar3;
  char *begin_00;
  char *pcVar4;
  basic_format_specs<char> specs;
  format_arg arg;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  adapter;
  unkbyte10 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_98;
  undefined4 local_88;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  buffer<char> *local_48;
  unsigned_long_long local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pcVar4 = begin + 1;
  if (pcVar4 == end) {
    pcVar4 = "invalid format string";
    goto LAB_0011ada8;
  }
  if (*pcVar4 == '{') {
    format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text(handler,pcVar4,begin + 2);
    goto LAB_0011ad74;
  }
  if (*pcVar4 != '}') {
    local_78.arg_id = 0;
    local_78.handler = handler;
    pcVar4 = parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                       (pcVar4,end,&local_78);
    if (pcVar4 == end) {
      cVar2 = '\0';
    }
    else {
      cVar2 = *pcVar4;
    }
    if (cVar2 == ':') {
      pcVar4 = format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               ::on_format_specs(handler,local_78.arg_id,pcVar4 + 1,end);
      if ((pcVar4 != end) && (*pcVar4 == '}')) goto LAB_0011ad74;
      pcVar4 = "unknown format specifier";
LAB_0011ada8:
      error_handler::on_error((error_handler *)handler,pcVar4);
    }
    if (cVar2 != '}') {
      pcVar4 = "missing \'}\' in format string";
      goto LAB_0011ada8;
    }
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              ((format_arg *)&local_98.string,(detail *)&handler->context,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
               (ulong)(uint)local_78.arg_id,in_ECX);
    out_01.container =
         (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
         container;
    switch(local_88) {
    case 1:
      goto switchD_0011ab44_caseD_1;
    case 2:
      goto switchD_0011ab44_caseD_2;
    case 3:
      goto switchD_0011ab44_caseD_3;
    case 4:
      goto switchD_0011ab44_caseD_4;
    case 5:
      goto switchD_0011ab44_caseD_5;
    case 6:
      goto switchD_0011ab44_caseD_6;
    case 7:
      goto switchD_0011ab44_caseD_7;
    case 8:
      goto switchD_0011ab44_caseD_8;
    case 9:
      goto switchD_0011ab44_caseD_9;
    case 10:
      goto switchD_0011ab44_caseD_a;
    case 0xb:
      goto switchD_0011ab44_caseD_b;
    case 0xc:
      goto switchD_0011ab44_caseD_c;
    case 0xd:
      goto switchD_0011ab44_caseD_d;
    case 0xe:
      goto switchD_0011ab44_caseD_e;
    case 0xf:
      goto switchD_0011ab44_caseD_f;
    }
    goto switchD_0011ab44_default;
  }
  uVar1 = (handler->parse_context).next_arg_id_;
  if ((int)uVar1 < 0) {
    handler = (format_handler<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)&handler->parse_context;
    pcVar4 = "cannot switch from manual to automatic argument indexing";
    goto LAB_0011ada8;
  }
  (handler->parse_context).next_arg_id_ = uVar1 + 1;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)&local_98.string,(detail *)&handler->context,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)uVar1,
             in_ECX);
  out_01.container =
       (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  switch(local_88) {
  case 1:
switchD_0011ab44_caseD_1:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                   (out_01.container,local_98.int_value);
    break;
  case 2:
switchD_0011ab44_caseD_2:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                   (out_01.container,local_98.uint_value);
    break;
  case 3:
switchD_0011ab44_caseD_3:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                   (out_01.container,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
    break;
  case 4:
switchD_0011ab44_caseD_4:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                   (out_01.container,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
    break;
  case 5:
switchD_0011ab44_caseD_5:
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         local_98.long_long_value._4_4_;
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         local_98.int_value;
    value._10_6_ = in_stack_ffffffffffffff62;
    value._0_10_ = in_stack_ffffffffffffff58;
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                   (out_01.container,out,(__int128)value);
    break;
  case 6:
switchD_0011ab44_caseD_6:
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         local_98.long_long_value._4_4_;
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         local_98.int_value;
    value_00._10_6_ = in_stack_ffffffffffffff62;
    value_00._0_10_ = in_stack_ffffffffffffff58;
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                   (out_01.container,out_00,(unsigned___int128)value_00);
    break;
  case 7:
switchD_0011ab44_caseD_7:
    begin_00 = "false";
    if ((ulong)local_98.bool_value != 0) {
      begin_00 = "true";
    }
    uVar3 = (ulong)local_98.bool_value ^ 5;
    goto LAB_0011ad2c;
  case 8:
switchD_0011ab44_caseD_8:
    out_01.container =
         (buffer<char> *)
         write<char,fmt::v7::detail::buffer_appender<char>>(out_01.container,local_98.char_value);
    break;
  case 9:
switchD_0011ab44_caseD_9:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                   (out_01.container,local_98.float_value);
    break;
  case 10:
switchD_0011ab44_caseD_a:
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                   (out_01.container,
                    (double)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
    break;
  case 0xb:
switchD_0011ab44_caseD_b:
    specs.type = '\0';
    specs._9_1_ = 0;
    specs.fill.data_[0] = ' ';
    specs.fill.data_[1] = '\0';
    specs.fill.data_[2] = '\0';
    specs.fill.data_[3] = '\0';
    specs.fill.size_ = '\x01';
    specs._15_1_ = 0;
    specs.width = 0;
    specs.precision = -1;
    out_01.container =
         (buffer<char> *)
         write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                   (out_01.container,
                    (longdouble)
                    CONCAT28(local_98.int128_value._8_2_,
                             CONCAT44(local_98.long_long_value._4_4_,local_98.int_value)),specs,
                    (locale_ref)0x0);
    break;
  case 0xc:
switchD_0011ab44_caseD_c:
    out_01.container =
         (buffer<char> *)
         write<char,fmt::v7::detail::buffer_appender<char>>
                   (out_01.container,
                    (char *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
    break;
  case 0xd:
switchD_0011ab44_caseD_d:
    begin_00 = (char *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value);
    uVar3 = CONCAT62(local_98.int128_value._10_6_,local_98.int128_value._8_2_);
LAB_0011ad2c:
    buffer<char>::append<char>(out_01.container,begin_00,begin_00 + uVar3);
    break;
  case 0xe:
switchD_0011ab44_caseD_e:
    out_01.container =
         (buffer<char> *)
         write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                   (out_01.container,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),
                    (basic_format_specs<char> *)0x0);
    break;
  case 0xf:
switchD_0011ab44_caseD_f:
    local_40 = (handler->context).args_.desc_;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    local_38 = *(undefined4 *)&(handler->context).args_.field_1;
    uStack_34 = *(undefined4 *)((long)&(handler->context).args_.field_1 + 4);
    uStack_30 = *(undefined4 *)&(handler->context).loc_.locale_;
    uStack_2c = *(undefined4 *)((long)&(handler->context).loc_.locale_ + 4);
    local_48 = out_01.container;
    (*(code *)CONCAT62(local_98.int128_value._10_6_,local_98.int128_value._8_2_))
              (CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),&local_68,&local_48);
    out_01.container = local_48;
  }
switchD_0011ab44_default:
  (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       out_01.container;
LAB_0011ad74:
  return pcVar4 + 1;
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}